

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phyr_math.h
# Opt level: O0

bool __thiscall phyr::_Mat4x4::operator==(_Mat4x4 *this,Mat4x4 *m)

{
  double *pdVar1;
  double dVar2;
  int j;
  int i;
  Mat4x4 *m_local;
  _Mat4x4 *this_local;
  
  i = 0;
  do {
    if (3 < i) {
      return true;
    }
    for (j = 0; j < 4; j = j + 1) {
      dVar2 = this->d[i][j];
      pdVar1 = m->d[i] + j;
      if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) {
        return false;
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

bool operator==(const Mat4x4& m) const {
        for (int i = 0; i < 4; i++)
            for (int j = 0; j < 4; j++)
                if (d[i][j] != m.d[i][j]) return false;
        return true;
    }